

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O0

void construction_worker_thread<std::pair<int,float>>
               (int number_of_threads,int thread_id,
               directed_flag_complex_in_memory_t<std::pair<int,_float>_> *result,
               directed_graph_t *graph,int max_dimension)

{
  byte bVar1;
  ulong uVar2;
  vertex_index_t vVar3;
  directed_graph_t *in_RCX;
  vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
  *in_RDX;
  int in_ESI;
  int in_EDI;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *unaff_retaddr;
  directed_graph_t *in_stack_00000008;
  directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *in_stack_00000010;
  int b;
  size_t vertex_offset;
  size_t bits;
  size_t offset;
  vector<unsigned_short,_std::allocator<unsigned_short>_> possible_vertices;
  size_t index;
  size_t number_of_vertices;
  undefined6 in_stack_ffffffffffffff88;
  vertex_index_t in_stack_ffffffffffffff8e;
  directed_graph_t *in_stack_ffffffffffffff90;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffa0;
  ulong local_58;
  ulong local_50;
  ulong local_30;
  
  vVar3 = directed_graph_t::vertex_number(in_RCX);
  for (local_30 = (ulong)in_ESI; local_30 < vVar3; local_30 = (long)in_EDI + local_30) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x1d0e11);
    for (local_50 = 0; local_50 < in_RCX->incidence_row_length; local_50 = local_50 + 1) {
      local_58 = directed_graph_t::get_outgoing_chunk
                           (in_stack_ffffffffffffff90,in_stack_ffffffffffffff8e,0x1d0e4d);
      in_stack_ffffffffffffffa0 =
           (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(local_50 << 6);
      while (local_58 != 0) {
        bVar1 = 0;
        for (uVar2 = local_58; (uVar2 & 1) == 0; uVar2 = uVar2 >> 1 | 0x8000000000000000) {
          bVar1 = bVar1 + 1;
        }
        local_58 = local_58 & ~(1L << ((ulong)bVar1 & 0x3f));
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                  ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                   in_stack_ffffffffffffff90,
                   (value_type_conflict1 *)
                   CONCAT26(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff88));
      }
    }
    std::
    vector<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
    ::operator[](in_RDX,local_30);
    construct_children<std::pair<int,float>>
              (in_stack_00000010,in_stack_00000008,unaff_retaddr,in_EDI,in_ESI);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(in_stack_ffffffffffffffa0)
    ;
  }
  return;
}

Assistant:

void construction_worker_thread(int number_of_threads, int thread_id,
                                directed_flag_complex_in_memory_t<ExtraData>* result, const directed_graph_t* graph,
                                int max_dimension) {
	const size_t number_of_vertices = graph->vertex_number();

	for (size_t index = thread_id; index < number_of_vertices; index += number_of_threads) {
		// Compute possible vertices
		std::vector<vertex_index_t> possible_vertices;
		for (size_t offset = 0; offset < graph->incidence_row_length; offset++) {
			size_t bits = graph->get_outgoing_chunk(vertex_index_t(index), vertex_index_t(offset));
			size_t vertex_offset = offset << 6;

			while (bits > 0) {
				// Get the least significant non-zero bit
				auto b = __builtin_ctzl(bits);

				// Unset this bit
				bits &= ~(ONE_ << b);
				possible_vertices.push_back(vertex_index_t(vertex_offset + b));
			}
		}
		construct_children(result->vertex_cells[index], *graph, possible_vertices, max_dimension);
	}
}